

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int read_definition_file(char *filename)

{
  int iVar1;
  za_file *zf_00;
  za_file *zf;
  char *filename_local;
  
  zf_00 = coda_za_open(filename,handle_ziparchive_error);
  if (zf_00 == (za_file *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    iVar1 = parse_entry(zf_00,ze_index,(char *)0x0,(coda_product_class *)0x0,
                        (coda_product_definition *)0x0);
    if (iVar1 == 0) {
      coda_za_close(zf_00);
      filename_local._4_4_ = 0;
    }
    else {
      coda_za_close(zf_00);
      filename_local._4_4_ = -1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int read_definition_file(const char *filename)
{
    za_file *zf;

    zf = za_open(filename, handle_ziparchive_error);
    if (zf == NULL)
    {
        return -1;
    }

    if (parse_entry(zf, ze_index, NULL, NULL, NULL) != 0)
    {
        za_close(zf);
        return -1;
    }

    za_close(zf);

    return 0;
}